

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.h
# Opt level: O3

NodeRef __thiscall
embree::sse2::BVHNBuilderVirtual<4>::
BVHNBuilderT<embree::sse2::CreateLeafSpatial<4,_embree::QuadMv<4>_>_>::createLeaf
          (BVHNBuilderT<embree::sse2::CreateLeafSpatial<4,_embree::QuadMv<4>_>_> *this,
          PrimRef *prims,range<unsigned_long> *set,Allocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  undefined4 *puVar2;
  pointer *pppTVar3;
  FastAllocator *this_00;
  ThreadLocal *pTVar4;
  ThreadLocal2 *this_01;
  iterator __position;
  Ref<embree::Geometry> *pRVar5;
  Geometry *pGVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  char *pcVar24;
  char *pcVar25;
  size_t sVar26;
  ulong uVar27;
  long lVar28;
  unsigned_long uVar29;
  long lVar30;
  float *pfVar31;
  ulong uVar32;
  long lVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  vuint<4> vprimID;
  vuint<4> vgeomID;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  long local_98;
  BVHNBuilderT<embree::sse2::CreateLeafSpatial<4,_embree::QuadMv<4>_>_> *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  float local_58 [10];
  
  uVar29 = set->_begin;
  uVar21 = (set->_end - uVar29) + 3;
  uVar22 = uVar21 >> 2;
  local_c8 = uVar22 * 0xe0;
  this_00 = alloc->alloc;
  pTVar4 = alloc->talloc1;
  this_01 = pTVar4->parent;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    uStack_f0 = CONCAT71(uStack_f0._1_7_,1);
    local_f8 = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_128 = &FastAllocator::s_thread_local_allocators_lock;
    uStack_120 = CONCAT71(uStack_120._1_7_,1);
    local_88 = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,(ThreadLocal2 **)&local_88);
    }
    else {
      *__position._M_current = this_01;
      pppTVar3 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar3 = *pppTVar3 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if ((char)uStack_f0 == '\x01') {
      MutexSys::unlock(&local_f8->mutex);
    }
  }
  uVar32 = local_c8;
  pTVar4->bytesUsed = pTVar4->bytesUsed + local_c8;
  sVar26 = pTVar4->cur;
  uVar27 = (ulong)(-(int)sVar26 & 0xf);
  uVar23 = sVar26 + local_c8 + uVar27;
  pTVar4->cur = uVar23;
  if (pTVar4->end < uVar23) {
    pTVar4->cur = sVar26;
    uVar23 = pTVar4->allocBlockSize;
    if (local_c8 * 4 < uVar23 || local_c8 * 4 - uVar23 == 0) {
      local_128 = (undefined8 *)uVar23;
      pcVar24 = (char *)FastAllocator::malloc(this_00,(size_t)&local_128);
      pTVar4->ptr = pcVar24;
      sVar26 = (pTVar4->end - pTVar4->cur) + pTVar4->bytesWasted;
      pTVar4->bytesWasted = sVar26;
      pTVar4->end = (size_t)local_128;
      pTVar4->cur = uVar32;
      if (local_128 < uVar32) {
        pTVar4->cur = 0;
        local_128 = (undefined8 *)pTVar4->allocBlockSize;
        pcVar24 = (char *)FastAllocator::malloc(this_00,(size_t)&local_128);
        pTVar4->ptr = pcVar24;
        sVar26 = (pTVar4->end - pTVar4->cur) + pTVar4->bytesWasted;
        pTVar4->bytesWasted = sVar26;
        pTVar4->end = (size_t)local_128;
        pTVar4->cur = uVar32;
        if (local_128 < uVar32) {
          pTVar4->cur = 0;
          pcVar24 = (char *)0x0;
          goto LAB_00c2fa6c;
        }
      }
      pTVar4->bytesWasted = sVar26;
    }
    else {
      pcVar24 = (char *)FastAllocator::malloc(this_00,(size_t)&local_c8);
    }
  }
  else {
    pTVar4->bytesWasted = pTVar4->bytesWasted + uVar27;
    pcVar24 = pTVar4->ptr + (uVar23 - local_c8);
  }
LAB_00c2fa6c:
  if (3 < uVar21) {
    lVar30 = uVar22 + (uVar22 == 0);
    lVar28 = 0;
    local_98 = lVar30;
    local_90 = this;
    do {
      uVar21 = set->_end;
      fVar37 = -NAN;
      fVar34 = -NAN;
      fVar35 = -NAN;
      fVar36 = -NAN;
      local_58[4] = -NAN;
      local_58[5] = -NAN;
      local_58[6] = -NAN;
      local_58[7] = -NAN;
      local_58[0] = -NAN;
      local_58[1] = -NAN;
      local_58[2] = -NAN;
      local_58[3] = -NAN;
      local_108 = 0;
      uStack_100 = 0;
      local_118 = 0;
      uStack_110 = 0;
      local_128 = (undefined8 *)0x0;
      uStack_120 = 0;
      local_d8 = 0;
      uStack_d0 = 0;
      local_e8 = 0;
      uStack_e0 = 0;
      local_f8 = (ThreadLocal2 *)0x0;
      uStack_f0 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_88 = (ThreadLocal2 *)0x0;
      uStack_80 = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      local_c8 = 0;
      uStack_c0 = 0;
      if (uVar29 < uVar21) {
        pRVar5 = (((this->createLeafFunc).bvh)->scene->geometries).items;
        pfVar31 = prims[uVar29].upper.field_0.m128 + 3;
        uVar32 = 0;
        do {
          fVar34 = *pfVar31;
          pGVar6 = pRVar5[(uint)pfVar31[-4]].ptr;
          lVar33 = (ulong)(uint)fVar34 *
                   pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          lVar30 = *(long *)&pGVar6->field_0x58;
          lVar7 = *(long *)&pGVar6[1].time_range.upper;
          p_Var8 = pGVar6[1].intersectionFilterN;
          puVar2 = (undefined4 *)(lVar7 + (ulong)*(uint *)(lVar30 + lVar33) * (long)p_Var8);
          uVar9 = *puVar2;
          uVar10 = puVar2[1];
          uVar11 = puVar2[2];
          puVar2 = (undefined4 *)(lVar7 + (ulong)*(uint *)(lVar30 + 4 + lVar33) * (long)p_Var8);
          uVar12 = *puVar2;
          uVar13 = puVar2[1];
          uVar14 = puVar2[2];
          puVar2 = (undefined4 *)(lVar7 + (ulong)*(uint *)(lVar30 + 8 + lVar33) * (long)p_Var8);
          uVar15 = *puVar2;
          uVar16 = puVar2[1];
          uVar17 = puVar2[2];
          puVar2 = (undefined4 *)(lVar7 + (ulong)*(uint *)(lVar30 + 0xc + lVar33) * (long)p_Var8);
          uVar18 = *puVar2;
          uVar19 = puVar2[1];
          uVar20 = puVar2[2];
          local_58[uVar32 + 4] = pfVar31[-4];
          local_58[uVar32] = fVar34;
          *(undefined4 *)((long)&local_128 + uVar32 * 4) = uVar9;
          *(undefined4 *)((long)&local_118 + uVar32 * 4) = uVar10;
          *(undefined4 *)((long)&local_108 + uVar32 * 4) = uVar11;
          *(undefined4 *)((long)&local_f8 + uVar32 * 4) = uVar12;
          *(undefined4 *)((long)&local_e8 + uVar32 * 4) = uVar13;
          *(undefined4 *)((long)&local_d8 + uVar32 * 4) = uVar14;
          *(undefined4 *)((long)&local_88 + uVar32 * 4) = uVar15;
          *(undefined4 *)((long)&local_78 + uVar32 * 4) = uVar16;
          *(undefined4 *)((long)&local_68 + uVar32 * 4) = uVar17;
          *(undefined4 *)((long)&local_c8 + uVar32 * 4) = uVar18;
          *(undefined4 *)((long)&local_b8 + uVar32 * 4) = uVar19;
          *(undefined4 *)((long)&local_a8 + uVar32 * 4) = uVar20;
          uVar23 = uVar32 + 1;
          if (2 < uVar32) break;
          lVar30 = uVar32 + uVar29;
          pfVar31 = pfVar31 + 8;
          uVar32 = uVar23;
        } while (lVar30 + 1U < uVar21);
        uVar29 = uVar29 + uVar23;
        lVar30 = local_98;
        this = local_90;
        fVar34 = local_58[0];
        fVar35 = local_58[1];
        fVar36 = local_58[2];
        fVar37 = local_58[3];
      }
      else {
        local_58[7] = -NAN;
        local_58[4] = -NAN;
        local_58[5] = -NAN;
        local_58[6] = -NAN;
        local_a8._0_4_ = 0;
        local_a8._4_4_ = 0;
        uStack_a0._0_4_ = 0;
        uStack_a0._4_4_ = 0;
        local_b8._0_4_ = 0;
        local_b8._4_4_ = 0;
        uStack_b0._0_4_ = 0;
        uStack_b0._4_4_ = 0;
        local_c8._0_4_ = 0;
        local_c8._4_4_ = 0;
        uStack_c0._0_4_ = 0;
        uStack_c0._4_4_ = 0;
        local_68._0_4_ = 0;
        local_68._4_4_ = 0;
        uStack_60._0_4_ = 0;
        uStack_60._4_4_ = 0;
        local_78._0_4_ = 0;
        local_78._4_4_ = 0;
        uStack_70._0_4_ = 0;
        uStack_70._4_4_ = 0;
        local_88._0_4_ = 0;
        local_88._4_4_ = 0;
        uStack_80._0_4_ = 0;
        uStack_80._4_4_ = 0;
        local_d8._0_4_ = 0;
        local_d8._4_4_ = 0;
        uStack_d0._0_4_ = 0;
        uStack_d0._4_4_ = 0;
        local_e8._0_4_ = 0;
        local_e8._4_4_ = 0;
        uStack_e0._0_4_ = 0;
        uStack_e0._4_4_ = 0;
        local_f8._0_4_ = 0;
        local_f8._4_4_ = 0;
        uStack_f0._0_4_ = 0;
        uStack_f0._4_4_ = 0;
        local_108._0_4_ = 0;
        local_108._4_4_ = 0;
        uStack_100._0_4_ = 0;
        uStack_100._4_4_ = 0;
        local_118._0_4_ = 0;
        local_118._4_4_ = 0;
        uStack_110._0_4_ = 0;
        uStack_110._4_4_ = 0;
        local_128._0_4_ = 0;
        local_128._4_4_ = 0;
        uStack_120._0_4_ = 0;
        uStack_120._4_4_ = 0;
      }
      pcVar25 = pcVar24 + lVar28 * 0xe0;
      *(undefined4 *)pcVar25 = (undefined4)local_128;
      *(undefined4 *)(pcVar25 + 4) = local_128._4_4_;
      *(undefined4 *)(pcVar25 + 8) = (undefined4)uStack_120;
      *(undefined4 *)(pcVar25 + 0xc) = uStack_120._4_4_;
      *(undefined4 *)(pcVar25 + 0x10) = (undefined4)local_118;
      *(undefined4 *)(pcVar25 + 0x14) = local_118._4_4_;
      *(undefined4 *)(pcVar25 + 0x18) = (undefined4)uStack_110;
      *(undefined4 *)(pcVar25 + 0x1c) = uStack_110._4_4_;
      *(undefined4 *)(pcVar25 + 0x20) = (undefined4)local_108;
      *(undefined4 *)(pcVar25 + 0x24) = local_108._4_4_;
      *(undefined4 *)(pcVar25 + 0x28) = (undefined4)uStack_100;
      *(undefined4 *)(pcVar25 + 0x2c) = uStack_100._4_4_;
      *(undefined4 *)(pcVar25 + 0x30) = (undefined4)local_f8;
      *(undefined4 *)(pcVar25 + 0x34) = local_f8._4_4_;
      *(undefined4 *)(pcVar25 + 0x38) = (undefined4)uStack_f0;
      *(undefined4 *)(pcVar25 + 0x3c) = uStack_f0._4_4_;
      *(undefined4 *)(pcVar25 + 0x40) = (undefined4)local_e8;
      *(undefined4 *)(pcVar25 + 0x44) = local_e8._4_4_;
      *(undefined4 *)(pcVar25 + 0x48) = (undefined4)uStack_e0;
      *(undefined4 *)(pcVar25 + 0x4c) = uStack_e0._4_4_;
      *(undefined4 *)(pcVar25 + 0x50) = (undefined4)local_d8;
      *(undefined4 *)(pcVar25 + 0x54) = local_d8._4_4_;
      *(undefined4 *)(pcVar25 + 0x58) = (undefined4)uStack_d0;
      *(undefined4 *)(pcVar25 + 0x5c) = uStack_d0._4_4_;
      *(undefined4 *)(pcVar25 + 0x60) = (undefined4)local_88;
      *(undefined4 *)(pcVar25 + 100) = local_88._4_4_;
      *(undefined4 *)(pcVar25 + 0x68) = (undefined4)uStack_80;
      *(undefined4 *)(pcVar25 + 0x6c) = uStack_80._4_4_;
      *(undefined4 *)(pcVar25 + 0x70) = (undefined4)local_78;
      *(undefined4 *)(pcVar25 + 0x74) = local_78._4_4_;
      *(undefined4 *)(pcVar25 + 0x78) = (undefined4)uStack_70;
      *(undefined4 *)(pcVar25 + 0x7c) = uStack_70._4_4_;
      *(undefined4 *)(pcVar25 + 0x80) = (undefined4)local_68;
      *(undefined4 *)(pcVar25 + 0x84) = local_68._4_4_;
      *(undefined4 *)(pcVar25 + 0x88) = (undefined4)uStack_60;
      *(undefined4 *)(pcVar25 + 0x8c) = uStack_60._4_4_;
      *(undefined4 *)(pcVar25 + 0x90) = (undefined4)local_c8;
      *(undefined4 *)(pcVar25 + 0x94) = local_c8._4_4_;
      *(undefined4 *)(pcVar25 + 0x98) = (undefined4)uStack_c0;
      *(undefined4 *)(pcVar25 + 0x9c) = uStack_c0._4_4_;
      *(undefined4 *)(pcVar25 + 0xa0) = (undefined4)local_b8;
      *(undefined4 *)(pcVar25 + 0xa4) = local_b8._4_4_;
      *(undefined4 *)(pcVar25 + 0xa8) = (undefined4)uStack_b0;
      *(undefined4 *)(pcVar25 + 0xac) = uStack_b0._4_4_;
      *(undefined4 *)(pcVar25 + 0xb0) = (undefined4)local_a8;
      *(undefined4 *)(pcVar25 + 0xb4) = local_a8._4_4_;
      *(undefined4 *)(pcVar25 + 0xb8) = (undefined4)uStack_a0;
      *(undefined4 *)(pcVar25 + 0xbc) = uStack_a0._4_4_;
      *(float *)(pcVar25 + 0xc0) = local_58[4];
      *(float *)(pcVar25 + 0xc4) = local_58[5];
      *(float *)(pcVar25 + 200) = local_58[6];
      *(float *)(pcVar25 + 0xcc) = local_58[7];
      *(float *)(pcVar25 + 0xd0) = fVar34;
      *(float *)(pcVar25 + 0xd4) = fVar35;
      *(float *)(pcVar25 + 0xd8) = fVar36;
      *(float *)(pcVar25 + 0xdc) = fVar37;
      lVar28 = lVar28 + 1;
    } while (lVar28 != lVar30);
  }
  uVar21 = 7;
  if (uVar22 < 7) {
    uVar21 = uVar22;
  }
  return (NodeRef)(uVar21 | (ulong)pcVar24 | 8);
}

Assistant:

NodeRef createLeaf (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) {
            return createLeafFunc(prims,set,alloc);
          }